

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trap.c
# Opt level: O2

int disarm_shooting_trap(trap *ttmp,int otyp,schar dx,schar dy)

{
  int x;
  uint uVar1;
  int iVar2;
  
  uVar1 = try_disarm(ttmp,'\0',dx,dy);
  if (1 < uVar1) {
    pline("You disarm %s trap.",the_your[(byte)ttmp->field_0x8 >> 7]);
    x = 0x32;
    if (otyp == 8) {
      x = 10;
    }
    iVar2 = rnl(x);
    cnv_trap_obj(otyp,x - iVar2,ttmp);
    uVar1 = 1;
  }
  return uVar1;
}

Assistant:

static int disarm_shooting_trap(struct trap *ttmp, int otyp, schar dx, schar dy)
{
	int fails = try_disarm(ttmp, FALSE, dx, dy);

	if (fails < 2)
	    return fails;
	pline("You disarm %s trap.", the_your[ttmp->madeby_u]);
	cnv_trap_obj(otyp, otyp == SHURIKEN ? 10-rnl(10) : 50-rnl(50), ttmp);
	return 1;
}